

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.hpp
# Opt level: O0

type effolkronium::
     basic_random_base<effolkronium::basic_random_thread_local<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_effolkronium::seeder_default,_std::uniform_int_distribution,_std::uniform_real_distribution,_std::bernoulli_distribution>,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_effolkronium::seeder_default,_std::uniform_int_distribution,_std::uniform_real_distribution,_std::bernoulli_distribution>
     ::get<int>(int from,int to)

{
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *pmVar1;
  uniform_int_distribution<int> local_24;
  uniform_int_distribution<int> local_1c;
  int local_14;
  int local_10;
  int to_local;
  int from_local;
  
  local_14 = to;
  local_10 = from;
  if (from < to) {
    std::uniform_int_distribution<int>::uniform_int_distribution(&local_1c,from,to);
    pmVar1 = engine_instance();
    to_local = std::uniform_int_distribution<int>::operator()(&local_1c,pmVar1);
  }
  else {
    std::uniform_int_distribution<int>::uniform_int_distribution(&local_24,to,from);
    pmVar1 = engine_instance();
    to_local = std::uniform_int_distribution<int>::operator()(&local_24,pmVar1);
  }
  return to_local;
}

Assistant:

static typename std::enable_if<details::is_uniform_int<T>::value
            , T>::type get( T from = (std::numeric_limits<T>::min)( ),
                            T to = (std::numeric_limits<T>::max)( ) ) {
            if( from < to ) // Allow range from higher to lower
                return IntegerDist<T>{ from, to }( engine_instance( ) );
            return IntegerDist<T>{ to, from }( engine_instance( ) );
        }